

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O0

errr Infofnt_init_data(char *name)

{
  errr eVar1;
  char *pcVar2;
  int local_2c;
  undefined8 uStack_28;
  wchar_t missing_count;
  char **missing;
  XFontSet fs;
  char *name_local;
  
  if (name == (char *)0x0) {
    name_local._4_4_ = -1;
  }
  else {
    fs = (XFontSet)name;
    missing = (char **)XCreateFontSet(Metadpy->dpy,name,&stack0xffffffffffffffd8,&local_2c,0);
    if (missing == (char **)0x0) {
      name_local._4_4_ = -1;
    }
    else {
      if (local_2c != 0) {
        XFreeStringList(uStack_28);
      }
      memset(Infofnt,0,0x20);
      eVar1 = Infofnt_prepare((XFontSet)missing);
      if (eVar1 == 0) {
        pcVar2 = string_make((char *)fs);
        Infofnt->name = pcVar2;
        Infofnt->field_0x19 = Infofnt->field_0x19 & 0xfd | 2;
        Infofnt->field_0x19 = Infofnt->field_0x19 & 0xfe | 1;
        name_local._4_4_ = 0;
      }
      else {
        XFreeFontSet(Metadpy->dpy,missing);
        name_local._4_4_ = -1;
      }
    }
  }
  return name_local._4_4_;
}

Assistant:

static errr Infofnt_init_data(const char *name)
{
	XFontSet fs;
	char **missing;
	int missing_count;

	/*** Load the info Fresh, using the name ***/

	/* If the name is not given, report an error */
	if (!name) return (-1);

	fs = XCreateFontSet(Metadpy->dpy, name, &missing, &missing_count, NULL);

	/* The load failed, try to recover */
	if (!fs) return (-1);
	if (missing_count)
		XFreeStringList(missing);

	/*** Init the font ***/

	/* Wipe the thing */
	(void)memset(Infofnt, 0, sizeof(infofnt));

	/* Attempt to prepare it */
	if (Infofnt_prepare(fs)) {
		/* Free the font */
		XFreeFontSet(Metadpy->dpy, fs);

		/* Fail */
		return (-1);
	}

	/* Save a copy of the font name */
	Infofnt->name = string_make(name);

	/* Mark it as nukable */
	Infofnt->nuke = 1;

	/* HACK - force all fonts to be printed character by character */
	Infofnt->mono = 1;

	/* Success */
	return (0);
}